

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O2

void DoKill(AActor *killtarget,AActor *inflictor,AActor *source,FName *damagetype,int flags,
           PClassActor *filter,FName *species)

{
  bool bVar1;
  bool bVar2;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  DAngle angle;
  FName local_40;
  FName local_3c;
  undefined8 local_38;
  
  bVar1 = DoCheckClass(killtarget,filter,SUB41((flags & 0x10U) >> 4,0));
  local_3c = (FName)species->Index;
  bVar2 = DoCheckSpecies(killtarget,&local_3c,SUB41((flags & 0x20U) >> 5,0));
  if ((flags & 0x40U) == 0) {
    if (!bVar1 || !bVar2) {
      return;
    }
  }
  else if (!bVar1 && !bVar2) {
    return;
  }
  angle.Degrees = extraout_XMM0_Qa;
  if (((((flags & 2U) != 0) && (((killtarget->flags).Value & 0x10000) != 0)) &&
      (((flags & 1U) != 0 || (((killtarget->flags2).Value & 0x8000000) == 0)))) &&
     ((((flags & 8U) != 0 || (((killtarget->flags7).Value & 0x40) == 0)) &&
      (((killtarget->flags5).Value & 0x40) == 0)))) {
    P_ExplodeMissile(killtarget,(line_t_conflict *)0x0,(AActor *)0x0);
    angle.Degrees = extraout_XMM0_Qa_00;
  }
  if ((flags & 4U) == 0) {
    local_40 = (FName)damagetype->Index;
    local_38 = 0;
    P_DamageMobj(killtarget,inflictor,source,killtarget->health,&local_40,0xd1,angle);
  }
  return;
}

Assistant:

static void DoKill(AActor *killtarget, AActor *inflictor, AActor *source, FName damagetype, int flags, PClassActor *filter, FName species)
{
	bool filterpass = DoCheckClass(killtarget, filter, !!(flags & KILS_EXFILTER)),
		speciespass = DoCheckSpecies(killtarget, species, !!(flags & KILS_EXSPECIES));
	if ((flags & KILS_EITHER) ? (filterpass || speciespass) : (filterpass && speciespass)) //Check this first. I think it'll save the engine a lot more time this way.
	{
		int dmgFlags = DMG_NO_ARMOR | DMG_NO_FACTOR;

		if (KILS_FOILINVUL)
			dmgFlags |= DMG_FOILINVUL;
		if (KILS_FOILBUDDHA)
			dmgFlags |= DMG_FOILBUDDHA;
	
		if ((killtarget->flags & MF_MISSILE) && (flags & KILS_KILLMISSILES))
		{
			//[MC] Now that missiles can set masters, lets put in a check to properly destroy projectiles. BUT FIRST! New feature~!
			//Check to see if it's invulnerable. Disregarded if foilinvul is on, but never works on a missile with NODAMAGE
			//since that's the whole point of it.
			if ((!(killtarget->flags2 & MF2_INVULNERABLE) || (flags & KILS_FOILINVUL)) &&
				(!(killtarget->flags7 & MF7_BUDDHA) || (flags & KILS_FOILBUDDHA)) && 
				!(killtarget->flags5 & MF5_NODAMAGE))
			{
				P_ExplodeMissile(killtarget, NULL, NULL);
			}
		}
		if (!(flags & KILS_NOMONSTERS))
		{
			P_DamageMobj(killtarget, inflictor, source, killtarget->health, damagetype, dmgFlags);
		}
	}
}